

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_pack.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  TestStruct a;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"sizeof(struct TestStruct) = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"c1 ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1," s ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1," c2 ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  poVar1 = std::operator<<(poVar1," i ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	struct TestStruct a;

	cout << "sizeof(struct TestStruct) = " << sizeof(struct TestStruct) << endl;
	cout << "c1 " << static_cast<const void *>(&a.c1)
	     << " s " << static_cast<const void *>(&a.s)
	     << " c2 "<< static_cast<const void *>(&a.c2)
	     << " i " << static_cast<const void *>(&a.i)
	     << endl;

	return 0;
}